

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_GetUtxoDataList_Test::TestBody(Psbt_GetUtxoDataList_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Psbt psbt;
  string *in_stack_fffffffffffffbc8;
  Psbt *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  AssertHelper local_348;
  Message local_340;
  AssertionResult local_338;
  AssertHelper local_328;
  Message local_320;
  int64_t local_318;
  undefined4 local_30c;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  string local_2c0;
  AssertionResult local_2a0;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_27c;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  string local_258;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  AssertionResult local_218;
  AssertHelper local_208;
  Message local_200;
  int64_t local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  AssertionResult local_1c0;
  AssertHelper local_1b0;
  Message local_1a8;
  string local_1a0;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  string local_138;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100;
  size_type local_f8;
  undefined4 local_ec;
  AssertionResult local_e8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_d8;
  allocator local_a9;
  string local_a8 [168];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCICmYYqZ6m0VNbNpf7jSlLZCJv6AkRE2IAxw0qY4pi9vKAiBLR/z1B7gJVBCOA3VnP9vdCExfu5lPbJUXIPLrL2u4ZgEBAwQBAAAAAQQWABSWLE4I8zbTr7w0FcnTWa4QQEcFICIGAlZSSEYLPBht7PE9sG8HJP1QtHzD5InDAHbINj1QOM7+GCpwR2AsAACAAAAAgAAAAIABAAAAAQAAAAABAL8CAAAAAcbS6jbi6AK1LdrGZdrL7S+DG1JjRZ4cpzT1yUXXUV5AAAAAAGpHMEQCIBG5bH0tDS6NyzcTjhisxGB1KWWt2cuHh99cNJ3w4q5mAiAuk68xtk9RZuVgWBlVXavsV755QwD62zcFLzHd3qmQXAEhA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rs/////wF4Uc0dAAAAABl2qRSNIEQ6kZaeO8oOJAzQ/+TcmMY94oisAAAAACICAtn2iI8oWhWmoYgKIgLCsjCkLXfPYtpqSKykGYJizaPHRzBEAiBm7JVulng81hIsnAdzKjrpkxtpq9r/HzYsKO1fqWco0wIgahbUrkb+1I09BJJzdhO9m1H+PiRTtERuRHxlvyyWfhABIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAA"
             ,&local_a9);
  cfd::Psbt::Psbt(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cfd::Psbt::GetUtxoDataAll((Psbt *)gtest_ar_11.message_.ptr_,gtest_ar_11._4_4_);
  local_ec = 2;
  local_f8 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size(&local_d8);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
             (char *)in_stack_fffffffffffffbe0,
             (int *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
             (unsigned_long *)in_stack_fffffffffffffbd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bac47);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x5bd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message((Message *)0x2bacaa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bad02);
  sVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size(&local_d8);
  if (sVar4 == 2) {
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,0);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_138,&pvVar5->txid);
    testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (char (*) [65])CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string((string *)&local_138);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bae0e);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5bf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x2bae71);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2baec6);
    local_15c = 1;
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,0);
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (int *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (uint *)in_stack_fffffffffffffbd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2baf7d);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5c0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x2bafe0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bb038);
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,0);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_1a0,&pvVar5->address);
    testing::internal::EqHelper<false>::Compare<char[36],std::__cxx11::string>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (char (*) [36])CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string((string *)&local_1a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message(&local_1a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bb130);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5c1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      testing::Message::~Message((Message *)0x2bb193);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bb1eb);
    local_1c4 = 6;
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,0);
    testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (AddressType *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (AddressType *)in_stack_fffffffffffffbd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
    if (!bVar1) {
      testing::Message::Message(&local_1d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bb2a5);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5c2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::Message::~Message((Message *)0x2bb308);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bb360);
    local_1ec = 100000000;
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,0);
    local_1f8 = cfd::core::Amount::GetSatoshiValue(&pvVar5->amount);
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (int *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (long *)in_stack_fffffffffffffbd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_200);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bb441);
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5c3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_208,&local_200);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      testing::Message::~Message((Message *)0x2bb4a4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bb4f9);
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,0);
    testing::internal::EqHelper<false>::Compare<char[101],std::__cxx11::string>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (char (*) [101])CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bb5a1);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5c4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x2bb5fe);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bb656);
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,1);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_258,&pvVar5->txid);
    testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (char (*) [65])CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string((string *)&local_258);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bb746);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5c6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x2bb7a3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bb7f8);
    local_27c = 0;
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,1);
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (int *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (uint *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bb8af);
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5c7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_290,&local_288);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      testing::Message::~Message((Message *)0x2bb90c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bb964);
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,1);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_2c0,&pvVar5->address);
    testing::internal::EqHelper<false>::Compare<char[35],std::__cxx11::string>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (char (*) [35])CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string((string *)&local_2c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_2c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bba57);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5c8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::Message::~Message((Message *)0x2bbab4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bbb09);
    local_2e4 = 2;
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,1);
    testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (AddressType *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (AddressType *)in_stack_fffffffffffffbd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2bbbbe);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5c9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message((Message *)0x2bbc1b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bbc73);
    local_30c = 0x1dcd5178;
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,1);
    local_318 = cfd::core::Amount::GetSatoshiValue(&pvVar5->amount);
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (char *)in_stack_fffffffffffffbe0,
               (int *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (long *)in_stack_fffffffffffffbd0);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_308);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_320);
      in_stack_fffffffffffffbe0 =
           (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x2bbd49);
      testing::internal::AssertHelper::AssertHelper
                (&local_328,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5ca,(char *)in_stack_fffffffffffffbe0);
      testing::internal::AssertHelper::operator=(&local_328,&local_320);
      testing::internal::AssertHelper::~AssertHelper(&local_328);
      testing::Message::~Message((Message *)0x2bbda6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bbdfb);
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_d8,1);
    testing::internal::EqHelper<false>::Compare<char[96],std::__cxx11::string>
              ((char *)CONCAT17(uVar2,in_stack_fffffffffffffbe8),(char *)in_stack_fffffffffffffbe0,
               (char (*) [96])CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
    if (!bVar1) {
      testing::Message::Message(&local_340);
      in_stack_fffffffffffffbd0 =
           (Psbt *)testing::AssertionResult::failure_message((AssertionResult *)0x2bbea4);
      testing::internal::AssertHelper::AssertHelper
                (&local_348,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5cb,(char *)in_stack_fffffffffffffbd0);
      testing::internal::AssertHelper::operator=(&local_348,&local_340);
      testing::internal::AssertHelper::~AssertHelper(&local_348);
      testing::Message::~Message((Message *)0x2bbf01);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2bbf56);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(in_stack_fffffffffffffbe0);
  cfd::Psbt::~Psbt(in_stack_fffffffffffffbd0);
  return;
}

Assistant:

TEST(Psbt, GetUtxoDataList) {
  Psbt psbt("cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCICmYYqZ6m0VNbNpf7jSlLZCJv6AkRE2IAxw0qY4pi9vKAiBLR/z1B7gJVBCOA3VnP9vdCExfu5lPbJUXIPLrL2u4ZgEBAwQBAAAAAQQWABSWLE4I8zbTr7w0FcnTWa4QQEcFICIGAlZSSEYLPBht7PE9sG8HJP1QtHzD5InDAHbINj1QOM7+GCpwR2AsAACAAAAAgAAAAIABAAAAAQAAAAABAL8CAAAAAcbS6jbi6AK1LdrGZdrL7S+DG1JjRZ4cpzT1yUXXUV5AAAAAAGpHMEQCIBG5bH0tDS6NyzcTjhisxGB1KWWt2cuHh99cNJ3w4q5mAiAuk68xtk9RZuVgWBlVXavsV755QwD62zcFLzHd3qmQXAEhA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rs/////wF4Uc0dAAAAABl2qRSNIEQ6kZaeO8oOJAzQ/+TcmMY94oisAAAAACICAtn2iI8oWhWmoYgKIgLCsjCkLXfPYtpqSKykGYJizaPHRzBEAiBm7JVulng81hIsnAdzKjrpkxtpq9r/HzYsKO1fqWco0wIgahbUrkb+1I09BJJzdhO9m1H+PiRTtERuRHxlvyyWfhABIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAA");
  auto utxos = psbt.GetUtxoDataAll(NetType::kTestnet);
  EXPECT_EQ(2, utxos.size());
  if (utxos.size() == 2) {
    EXPECT_EQ("c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26", utxos[0].txid.GetHex());
    EXPECT_EQ(1, utxos[0].vout);
    EXPECT_EQ("2MzbWwSa1GsmzGLhYbsYRACNhgx4RjqGtTi", utxos[0].address.GetAddress());
    EXPECT_EQ(AddressType::kP2shP2wpkhAddress, utxos[0].address_type);
    EXPECT_EQ(100000000, utxos[0].amount.GetSatoshiValue());
    EXPECT_EQ("sh(wpkh([2a704760/44'/0'/0'/1/1]02565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe))", utxos[0].descriptor);

    EXPECT_EQ("c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d", utxos[1].txid.GetHex());
    EXPECT_EQ(0, utxos[1].vout);
    EXPECT_EQ("mtPAE24cZ3k6NMCcxQJUbSpZnSVaCu96Wj", utxos[1].address.GetAddress());
    EXPECT_EQ(AddressType::kP2pkhAddress, utxos[1].address_type);
    EXPECT_EQ(499995000, utxos[1].amount.GetSatoshiValue());
    EXPECT_EQ("pkh([9d6b6d86/44'/0'/0'/0/1]02d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7)", utxos[1].descriptor);
  }
}